

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostringstream.cc
# Opt level: O0

int_type __thiscall strings::OStringStream::overflow(OStringStream *this,int c)

{
  bool bVar1;
  int_type local_18;
  int local_14;
  OStringStream *pOStack_10;
  int c_local;
  OStringStream *this_local;
  
  local_14 = c;
  pOStack_10 = this;
  if (*(long *)&(this->super_ostream).field_0x8 == 0) {
    __assert_fail("s_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/strings/ostringstream.cc"
                  ,0x17,"virtual OStringStream::Buf::int_type strings::OStringStream::overflow(int)"
                 );
  }
  local_18 = std::char_traits<char>::eof();
  bVar1 = std::char_traits<char>::eq_int_type(&local_14,&local_18);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::push_back((char)*(undefined8 *)&(this->super_ostream).field_0x8);
  }
  return 1;
}

Assistant:

OStringStream::Buf::int_type OStringStream::overflow(int c) {
  assert(s_);
  if (!Buf::traits_type::eq_int_type(c, Buf::traits_type::eof()))
    s_->push_back(static_cast<char>(c));
  return 1;
}